

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::traverseNotationDecl(TraverseSchema *this,DOMElement *elem)

{
  XMLStringPool *pXVar1;
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *this_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  XMLCh *src;
  XMLSize_t count;
  DOMElement *pDVar5;
  XMLCh *pubId;
  XMLCh *sysId;
  undefined4 extraout_var;
  XMLNotationDecl *this_01;
  XSAnnotation *annotation;
  NamespaceScopeManager nsMgr;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,elem,this->fSchemaInfo,this);
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,0x24,this,true,this->fNonXSAttList);
  src = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  if ((src == (XMLCh *)0x0) || (*src == L'\0')) {
    src = (XMLCh *)0x0;
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x55,
                      (XMLCh *)SchemaSymbols::fgELT_NOTATION,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0)
    ;
  }
  else {
    count = XMLString::stringLen(src);
    bVar2 = XMLChar1_0::isValidNCName(src,count);
    if (bVar2) {
      bVar2 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey
                        (this->fNotationRegistry,src,this->fTargetNSURI);
      if (!bVar2) {
        pDVar5 = XUtil::getFirstChildElement(&elem->super_DOMNode);
        pDVar5 = checkContent(this,elem,pDVar5,true,true);
        if (pDVar5 != (DOMElement *)0x0) {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x4d);
        }
        pubId = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_PUBLIC,UnKnown);
        sysId = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_SYSTEM,AnyURI);
        pXVar1 = this->fStringPool;
        this_00 = this->fNotationRegistry;
        uVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,src);
        iVar4 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar3);
        RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                  (this_00,(void *)CONCAT44(extraout_var,iVar4),this->fTargetNSURI,(char16_t *)0x0);
        this_01 = (XMLNotationDecl *)XMemory::operator_new(0x40,this->fGrammarPoolMemoryManager);
        XMLNotationDecl::XMLNotationDecl
                  (this_01,src,pubId,sysId,(XMLCh *)0x0,this->fGrammarPoolMemoryManager);
        this_01->fNameSpaceId = this->fTargetNSURI;
        (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0x12])
                  (this->fSchemaGrammar,this_01);
        if (this->fAnnotation == (XSAnnotation *)0x0) {
          if ((this->fScanner->fGenerateSyntheticAnnotations == true) &&
             (this->fNonXSAttList->fCurCount != 0)) {
            annotation = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
            this->fAnnotation = annotation;
            SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_01,annotation);
          }
        }
        else {
          SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_01,this->fAnnotation);
        }
      }
    }
    else {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,
                        (XMLCh *)SchemaSymbols::fgELT_NOTATION,src,(XMLCh *)0x0,(XMLCh *)0x0);
      src = (XMLCh *)0x0;
    }
  }
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return src;
}

Assistant:

const XMLCh* TraverseSchema::traverseNotationDecl(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_Notation, this, true, fNonXSAttList
    );

    // -----------------------------------------------------------------------
    // Process notation attributes/elements
    // -----------------------------------------------------------------------
    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    bool         nameEmpty = (!name || !*name) ? true : false;

    if (nameEmpty) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameGlobalElement,
                          SchemaSymbols::fgELT_NOTATION);
        return 0;
    }

    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                          SchemaSymbols::fgELT_NOTATION, name);
        return 0;
    }

    if (fNotationRegistry->containsKey(name, fTargetNSURI)) {
        return name;
    }

    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0)
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);

    const XMLCh* publicId = getElementAttValue(elem, SchemaSymbols::fgATT_PUBLIC);
    const XMLCh* systemId = getElementAttValue(elem, SchemaSymbols::fgATT_SYSTEM, DatatypeValidator::AnyURI);

    fNotationRegistry->put((void*) fStringPool->getValueForId(fStringPool->addOrFind(name)),
                           fTargetNSURI, 0);

    // for PSVI we need to store the notational decl
    XMLNotationDecl* decl = new (fGrammarPoolMemoryManager) XMLNotationDecl
        (
            name,
            publicId,
            systemId,
            0,
            fGrammarPoolMemoryManager
        );
    decl->setNameSpaceId(fTargetNSURI);
    fSchemaGrammar->putNotationDecl(decl);

    if (fAnnotation)
        fSchemaGrammar->putAnnotation(decl, fAnnotation);
    else if (fScanner->getGenerateSyntheticAnnotations() && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        fSchemaGrammar->putAnnotation(decl, fAnnotation);
    }
    return name;
}